

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O3

int __thiscall AbstractContentContext::c(AbstractContentContext *this,void *param_1,void *param_2)

{
  PrimitiveObjectsWriter *this_00;
  EStatusCode EVar1;
  int iVar2;
  undefined4 extraout_var;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  string local_40;
  
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  iVar2 = (*this->_vptr_AbstractContentContext[2])(this);
  ResourcesDictionary::AddProcsetResource
            ((ResourcesDictionary *)CONCAT44(extraout_var,iVar2),&KProcsetPDF_abi_cxx11_);
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::WriteDouble(this_00,in_XMM0_Qa,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,in_XMM1_Qa,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,in_XMM2_Qa,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,in_XMM3_Qa,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,in_XMM4_Qa,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,in_XMM5_Qa,eTokenSeparatorSpace);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"c","");
  PrimitiveObjectsWriter::WriteKeyword(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::c(	double inX1,double inY1, 
							double inX2, double inY2, 
							double inX3, double inY3)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteDouble(inX1);
	mPrimitiveWriter.WriteDouble(inY1);
	mPrimitiveWriter.WriteDouble(inX2);
	mPrimitiveWriter.WriteDouble(inY2);
	mPrimitiveWriter.WriteDouble(inX3);
	mPrimitiveWriter.WriteDouble(inY3);
	mPrimitiveWriter.WriteKeyword("c");
	return GetCurrentStatusCode();
}